

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4bce2::tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float>::gemmMx4<3>
          (tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [32];
  block_q8_0 *b;
  __m256 c;
  __m256 c_00;
  __m256 c_01;
  __m256 c_02;
  __m256 x;
  __m256i s;
  __m256 b_00;
  __m256i s_00;
  __m256 b_01;
  __m256i s_01;
  __m256 b_02;
  __m256i s_02;
  __m256 b_03;
  __m256i u;
  __m256 a;
  __m256i u_00;
  __m256 a_00;
  __m256i u_01;
  __m256 a_01;
  __m256i u_02;
  __m256 a_02;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long in_RCX;
  long in_RDX;
  block_q8_0 *b_04;
  block_q8_0 *b_05;
  block_q8_0 *b_06;
  long in_RSI;
  __m256i *in_RDI;
  long in_R8;
  float fVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar18;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *ptVar19;
  undefined8 uVar20;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined8 uVar21;
  int64_t i_1;
  int64_t j;
  __m256 dvec;
  __m128 da;
  int64_t i;
  __m256i bvec3;
  __m256i bvec2;
  __m256i bvec1;
  __m256i bvec0;
  __m128 db;
  uint64_t b_delta;
  int64_t l;
  __m256 Cv [4] [3];
  int64_t jj;
  int64_t ii;
  int64_t job;
  int64_t end;
  int64_t start;
  int64_t duty;
  int64_t tiles;
  int64_t xtiles;
  int64_t ytiles;
  undefined8 in_stack_fffffffffffff820;
  undefined8 in_stack_fffffffffffff828;
  undefined8 in_stack_fffffffffffff830;
  undefined8 uVar22;
  undefined8 uVar23;
  block_q5_0 *in_stack_fffffffffffff848;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *in_stack_fffffffffffff850;
  longlong lVar24;
  undefined1 auVar25 [24];
  undefined8 local_780;
  undefined8 uStack_778;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *this_00;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  long local_5b0;
  long local_5a8;
  undefined1 local_5a0 [20];
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  long local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  block_q5_0 *pbStack_4f8;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *ptStack_4f0;
  longlong lStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  long local_4c8;
  undefined8 local_4c0 [12];
  undefined8 auStack_460 [12];
  undefined8 auStack_400 [12];
  undefined8 auStack_3a0 [14];
  long local_330;
  long local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e0;
  long local_2d0;
  ulong local_2c0;
  undefined8 uStack_2b8;
  undefined1 local_2b0 [16];
  ulong local_2a0;
  undefined8 local_298;
  float local_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_274;
  float local_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  block_q5_0 *pbStack_b8;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *ptStack_b0;
  longlong lStack_a8;
  undefined8 local_a0;
  block_q5_0 *pbStack_98;
  tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *ptStack_90;
  longlong lStack_88;
  undefined1 local_80 [32];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined1 auVar12 [32];
  
  local_2f0 = (in_RDX - in_RSI) / 3;
  local_2f8 = (in_R8 - in_RCX) / 4;
  local_300 = local_2f8 * local_2f0;
  local_308 = (local_300 + *(int *)((long)in_RDI[1] + 0x1c) + -1) /
              (long)*(int *)((long)in_RDI[1] + 0x1c);
  local_320 = local_308 * (int)in_RDI[1][3];
  local_318 = local_320 + local_308;
  local_310 = local_320;
  local_2e0 = in_RCX;
  local_2d0 = in_RSI;
  if (local_300 < local_320 + local_308) {
    local_318 = local_300;
  }
  for (; local_320 < local_318; local_320 = local_320 + 1) {
    local_328 = local_2d0 + (local_320 / local_2f8) * 3;
    local_330 = local_2e0 + (local_320 % local_2f8) * 4;
    memset(local_4c0,0,0x180);
    for (local_4c8 = 0; local_4c8 < (*in_RDI)[3]; local_4c8 = local_4c8 + 1) {
      lVar1 = (*in_RDI)[1];
      lVar2 = in_RDI[1][1];
      b = (block_q8_0 *)((lVar2 * local_330 + local_4c8) * 0x22);
      local_2a0 = (ulong)*(ushort *)(lVar1 + (lVar2 * (local_330 + 3) + local_4c8) * 0x22) << 0x30 |
                  (ulong)*(ushort *)(lVar1 + (lVar2 * (local_330 + 2) + local_4c8) * 0x22) << 0x20 |
                  (ulong)*(ushort *)(lVar1 + (lVar2 * (local_330 + 1) + local_4c8) * 0x22) << 0x10 |
                  (ulong)*(ushort *)(b->qs + lVar1 + -2);
      local_298 = 0;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_2a0;
      local_2b0 = vpunpcklqdq_avx(auVar10,ZEXT816(0));
      local_2c0 = local_2b0._0_8_;
      uStack_2b8 = local_2b0._8_8_;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_2b0._0_8_;
      auVar10 = vcvtph2ps_f16c(auVar11);
      auVar12 = ZEXT1632(auVar10);
      load(in_RDI,(tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *)
                  ((*in_RDI)[1] + in_RDI[1][1] * local_330 * 0x22 + local_4c8 * 0x22),b);
      auVar13 = auVar12;
      load(in_RDI,(tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *)
                  ((*in_RDI)[1] + in_RDI[1][1] * (local_330 + 1) * 0x22 + local_4c8 * 0x22),b_04);
      auVar14 = auVar13;
      load(in_RDI,(tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *)
                  ((*in_RDI)[1] + in_RDI[1][1] * (local_330 + 2) * 0x22 + local_4c8 * 0x22),b_05);
      auVar15 = auVar14;
      load(in_RDI,(tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *)
                  ((*in_RDI)[1] + in_RDI[1][1] * (local_330 + 3) * 0x22 + local_4c8 * 0x22),b_06);
      for (local_568 = 0; auVar3 = _local_5a0, local_568 < 3; local_568 = local_568 + 1) {
        local_290 = unhalf(0);
        local_250 = CONCAT44(local_290,local_290);
        uStack_248 = CONCAT44(local_290,local_290);
        local_4e0 = auVar10._0_8_;
        uStack_4d8 = auVar10._8_8_;
        local_260 = local_4e0;
        uVar20 = local_260;
        uStack_258 = uStack_4d8;
        uVar21 = uStack_258;
        local_260._0_4_ = auVar10._0_4_;
        local_260._4_4_ = auVar10._4_4_;
        uStack_258._0_4_ = auVar10._8_4_;
        uStack_258._4_4_ = auVar10._12_4_;
        local_270 = local_290 * (float)local_260;
        fStack_26c = local_290 * local_260._4_4_;
        fStack_268 = local_290 * (float)uStack_258;
        fStack_264 = local_290 * uStack_258._4_4_;
        local_5a0._4_4_ = fStack_26c;
        local_5a0._0_4_ = local_270;
        uVar9 = local_5a0._0_8_;
        local_5a0._12_4_ = fStack_264;
        local_5a0._8_4_ = fStack_268;
        uVar18 = local_5a0._8_8_;
        local_5a0._0_16_ = auVar3._0_16_;
        local_5a0._16_4_ = (float)local_260;
        fStack_58c = local_260._4_4_;
        fStack_588 = (float)uStack_258;
        fStack_584 = uStack_258._4_4_;
        local_5a0._0_16_ = CONCAT88(uVar18,uVar9);
        _local_5a0 = vpermpd_avx2(_local_5a0,0x44);
        auVar3 = vpermilps_avx(_local_5a0,0);
        auVar16 = auVar3;
        fStack_28c = local_290;
        fStack_288 = local_290;
        fStack_284 = local_290;
        local_274 = local_290;
        local_260 = uVar20;
        uStack_258 = uVar21;
        load(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        in_stack_fffffffffffff820 = auVar16._0_8_;
        in_stack_fffffffffffff828 = auVar16._8_8_;
        in_stack_fffffffffffff830 = auVar16._16_8_;
        uVar22 = auVar16._24_8_;
        load(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        auVar7._8_8_ = in_stack_fffffffffffff828;
        auVar7._0_8_ = in_stack_fffffffffffff820;
        auVar7._16_8_ = in_stack_fffffffffffff830;
        auVar7._24_8_ = uVar22;
        auVar17 = vpsignb_avx2(auVar7,auVar16);
        auVar25 = auVar17._0_24_;
        local_500 = auVar12._0_8_;
        pbStack_4f8 = auVar12._8_8_;
        ptStack_4f0 = auVar12._16_8_;
        lStack_4e8 = auVar12._24_8_;
        uVar23 = local_500;
        in_stack_fffffffffffff848 = pbStack_4f8;
        in_stack_fffffffffffff850 = ptStack_4f0;
        lVar24 = lStack_4e8;
        local_80 = auVar16;
        local_60 = in_stack_fffffffffffff820;
        uStack_58 = in_stack_fffffffffffff828;
        uStack_50 = in_stack_fffffffffffff830;
        uStack_48 = uVar22;
        load(ptStack_4f0,pbStack_4f8);
        auVar6._8_8_ = in_stack_fffffffffffff848;
        auVar6._0_8_ = uVar23;
        auVar6._16_8_ = in_stack_fffffffffffff850;
        auVar6._24_8_ = lVar24;
        auVar5._8_8_ = pbStack_4f8;
        auVar5._0_8_ = local_500;
        auVar5._16_8_ = ptStack_4f0;
        auVar5._24_8_ = lStack_4e8;
        vpsignb_avx2(auVar6,auVar5);
        this_00 = auVar3._16_8_;
        u[1] = auVar25._0_8_;
        u[2] = auVar25._8_8_;
        u[3] = auVar25._16_8_;
        u[0] = lVar24;
        s[1] = uVar23;
        s[0] = uVar22;
        s[2] = (longlong)in_stack_fffffffffffff848;
        s[3] = (longlong)in_stack_fffffffffffff850;
        local_c0 = local_500;
        pbStack_b8 = pbStack_4f8;
        ptStack_b0 = ptStack_4f0;
        lStack_a8 = lStack_4e8;
        local_a0 = uVar23;
        pbStack_98 = in_stack_fffffffffffff848;
        ptStack_90 = in_stack_fffffffffffff850;
        lStack_88 = lVar24;
        updot(this_00,u,s);
        local_780 = auVar3._0_8_;
        uStack_778 = auVar3._8_8_;
        uStack_768 = auVar3._24_8_;
        a[2] = (float)auVar25._0_4_;
        a[3] = (float)auVar25._4_4_;
        a[4] = (float)auVar25._8_4_;
        a[5] = (float)auVar25._12_4_;
        a[6] = (float)auVar25._16_4_;
        a[7] = (float)auVar25._20_4_;
        a[0] = (float)(int)lVar24;
        a[1] = (float)(int)((ulong)lVar24 >> 0x20);
        b_00[2] = (float)(int)uVar23;
        b_00[3] = (float)(int)((ulong)uVar23 >> 0x20);
        b_00[0] = (float)(int)uVar22;
        b_00[1] = (float)(int)((ulong)uVar22 >> 0x20);
        b_00._16_8_ = in_stack_fffffffffffff848;
        b_00._24_8_ = in_stack_fffffffffffff850;
        c[2] = (float)(int)in_stack_fffffffffffff820;
        c[3] = (float)(int)((ulong)in_stack_fffffffffffff820 >> 0x20);
        c[0] = 2.757645e-39;
        c[1] = 0.0;
        c[4] = (float)(int)in_stack_fffffffffffff828;
        c[5] = (float)(int)((ulong)in_stack_fffffffffffff828 >> 0x20);
        c[6] = (float)(int)in_stack_fffffffffffff830;
        c[7] = (float)(int)((ulong)in_stack_fffffffffffff830 >> 0x20);
        ptVar19 = this_00;
        (anonymous_namespace)::madd<float__vector(8),float__vector(8)>(a,b_00,c);
        local_4c0[local_568 * 4] = local_780;
        local_4c0[local_568 * 4 + 1] = uStack_778;
        local_4c0[local_568 * 4 + 2] = ptVar19;
        local_4c0[local_568 * 4 + 3] = uStack_768;
        auVar3 = vpermilps_avx(_local_5a0,0x55);
        auVar16 = auVar3;
        load(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        auVar17 = auVar16;
        load(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        local_760 = auVar16._0_8_;
        uStack_758 = auVar16._8_8_;
        uStack_750 = auVar16._16_8_;
        uStack_748 = auVar16._24_8_;
        local_e0 = local_760;
        uStack_d8 = uStack_758;
        uStack_d0 = uStack_750;
        uStack_c8 = uStack_748;
        vpsignb_avx2(auVar16,auVar17);
        local_520 = auVar13._0_8_;
        uStack_518 = auVar13._8_8_;
        uStack_510 = auVar13._16_8_;
        uStack_508 = auVar13._24_8_;
        uVar9 = local_520;
        uVar18 = uStack_518;
        uVar20 = uStack_510;
        uVar21 = uStack_508;
        local_100 = auVar17;
        load(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        local_120 = local_520;
        uStack_118 = uStack_518;
        uStack_110 = uStack_510;
        uStack_108 = uStack_508;
        auVar4._8_8_ = uVar18;
        auVar4._0_8_ = uVar9;
        auVar4._16_8_ = uVar20;
        auVar4._24_8_ = uVar21;
        vpsignb_avx2(auVar13,auVar4);
        u_00[1] = auVar25._0_8_;
        u_00[2] = auVar25._8_8_;
        u_00[3] = auVar25._16_8_;
        u_00[0] = lVar24;
        s_00[1] = uVar23;
        s_00[0] = uVar22;
        s_00[2] = (longlong)in_stack_fffffffffffff848;
        s_00[3] = (longlong)in_stack_fffffffffffff850;
        local_140 = uVar9;
        uStack_138 = uVar18;
        uStack_130 = uVar20;
        uStack_128 = uVar21;
        updot(this_00,u_00,s_00);
        local_700 = auVar3._0_8_;
        uStack_6f8 = auVar3._8_8_;
        uStack_6f0 = auVar3._16_8_;
        uStack_6e8 = auVar3._24_8_;
        a_00[2] = (float)auVar25._0_4_;
        a_00[3] = (float)auVar25._4_4_;
        a_00[4] = (float)auVar25._8_4_;
        a_00[5] = (float)auVar25._12_4_;
        a_00[6] = (float)auVar25._16_4_;
        a_00[7] = (float)auVar25._20_4_;
        a_00[0] = (float)(int)lVar24;
        a_00[1] = (float)(int)((ulong)lVar24 >> 0x20);
        b_01[2] = (float)(int)uVar23;
        b_01[3] = (float)(int)((ulong)uVar23 >> 0x20);
        b_01[0] = (float)(int)uVar22;
        b_01[1] = (float)(int)((ulong)uVar22 >> 0x20);
        b_01._16_8_ = in_stack_fffffffffffff848;
        b_01._24_8_ = in_stack_fffffffffffff850;
        c_00[2] = (float)(int)in_stack_fffffffffffff820;
        c_00[3] = (float)(int)((ulong)in_stack_fffffffffffff820 >> 0x20);
        c_00[0] = 2.758322e-39;
        c_00[1] = 0.0;
        c_00[4] = (float)(int)in_stack_fffffffffffff828;
        c_00[5] = (float)(int)((ulong)in_stack_fffffffffffff828 >> 0x20);
        c_00[6] = (float)(int)in_stack_fffffffffffff830;
        c_00[7] = (float)(int)((ulong)in_stack_fffffffffffff830 >> 0x20);
        (anonymous_namespace)::madd<float__vector(8),float__vector(8)>(a_00,b_01,c_00);
        auStack_460[local_568 * 4] = local_700;
        auStack_460[local_568 * 4 + 1] = uStack_6f8;
        auStack_460[local_568 * 4 + 2] = uStack_6f0;
        auStack_460[local_568 * 4 + 3] = uStack_6e8;
        auVar3 = vpermilps_avx(_local_5a0,0xaa);
        auVar16 = auVar3;
        load(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        auVar17 = auVar16;
        load(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        local_6e0 = auVar16._0_8_;
        uStack_6d8 = auVar16._8_8_;
        uStack_6d0 = auVar16._16_8_;
        uStack_6c8 = auVar16._24_8_;
        local_160 = local_6e0;
        uStack_158 = uStack_6d8;
        uStack_150 = uStack_6d0;
        uStack_148 = uStack_6c8;
        vpsignb_avx2(auVar16,auVar17);
        local_540 = auVar14._0_8_;
        uStack_538 = auVar14._8_8_;
        uStack_530 = auVar14._16_8_;
        uStack_528 = auVar14._24_8_;
        uVar9 = local_540;
        uVar18 = uStack_538;
        uVar20 = uStack_530;
        uVar21 = uStack_528;
        local_180 = auVar17;
        load(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        local_1a0 = local_540;
        uStack_198 = uStack_538;
        uStack_190 = uStack_530;
        uStack_188 = uStack_528;
        auVar16._8_8_ = uVar18;
        auVar16._0_8_ = uVar9;
        auVar16._16_8_ = uVar20;
        auVar16._24_8_ = uVar21;
        vpsignb_avx2(auVar14,auVar16);
        u_01[1] = auVar25._0_8_;
        u_01[2] = auVar25._8_8_;
        u_01[3] = auVar25._16_8_;
        u_01[0] = lVar24;
        s_01[1] = uVar23;
        s_01[0] = uVar22;
        s_01[2] = (longlong)in_stack_fffffffffffff848;
        s_01[3] = (longlong)in_stack_fffffffffffff850;
        local_1c0 = uVar9;
        uStack_1b8 = uVar18;
        uStack_1b0 = uVar20;
        uStack_1a8 = uVar21;
        updot(this_00,u_01,s_01);
        local_680 = auVar3._0_8_;
        uStack_678 = auVar3._8_8_;
        uStack_670 = auVar3._16_8_;
        uStack_668 = auVar3._24_8_;
        a_01[2] = (float)auVar25._0_4_;
        a_01[3] = (float)auVar25._4_4_;
        a_01[4] = (float)auVar25._8_4_;
        a_01[5] = (float)auVar25._12_4_;
        a_01[6] = (float)auVar25._16_4_;
        a_01[7] = (float)auVar25._20_4_;
        a_01[0] = (float)(int)lVar24;
        a_01[1] = (float)(int)((ulong)lVar24 >> 0x20);
        b_02[2] = (float)(int)uVar23;
        b_02[3] = (float)(int)((ulong)uVar23 >> 0x20);
        b_02[0] = (float)(int)uVar22;
        b_02[1] = (float)(int)((ulong)uVar22 >> 0x20);
        b_02._16_8_ = in_stack_fffffffffffff848;
        b_02._24_8_ = in_stack_fffffffffffff850;
        c_01[2] = (float)(int)in_stack_fffffffffffff820;
        c_01[3] = (float)(int)((ulong)in_stack_fffffffffffff820 >> 0x20);
        c_01[0] = 2.758998e-39;
        c_01[1] = 0.0;
        c_01[4] = (float)(int)in_stack_fffffffffffff828;
        c_01[5] = (float)(int)((ulong)in_stack_fffffffffffff828 >> 0x20);
        c_01[6] = (float)(int)in_stack_fffffffffffff830;
        c_01[7] = (float)(int)((ulong)in_stack_fffffffffffff830 >> 0x20);
        (anonymous_namespace)::madd<float__vector(8),float__vector(8)>(a_01,b_02,c_01);
        auStack_400[local_568 * 4] = local_680;
        auStack_400[local_568 * 4 + 1] = uStack_678;
        auStack_400[local_568 * 4 + 2] = uStack_670;
        auStack_400[local_568 * 4 + 3] = uStack_668;
        auVar3 = vpermilps_avx(_local_5a0,0xff);
        auVar16 = auVar3;
        load(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        auVar17 = auVar16;
        load(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        local_660 = auVar16._0_8_;
        uStack_658 = auVar16._8_8_;
        uStack_650 = auVar16._16_8_;
        uStack_648 = auVar16._24_8_;
        local_1e0 = local_660;
        uStack_1d8 = uStack_658;
        uStack_1d0 = uStack_650;
        uStack_1c8 = uStack_648;
        vpsignb_avx2(auVar16,auVar17);
        local_560 = auVar15._0_8_;
        uStack_558 = auVar15._8_8_;
        uStack_550 = auVar15._16_8_;
        uStack_548 = auVar15._24_8_;
        uVar9 = local_560;
        uVar18 = uStack_558;
        uVar20 = uStack_550;
        uVar21 = uStack_548;
        local_200 = auVar17;
        load(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        local_220 = local_560;
        uStack_218 = uStack_558;
        uStack_210 = uStack_550;
        uStack_208 = uStack_548;
        auVar17._8_8_ = uVar18;
        auVar17._0_8_ = uVar9;
        auVar17._16_8_ = uVar20;
        auVar17._24_8_ = uVar21;
        vpsignb_avx2(auVar15,auVar17);
        u_02[1] = auVar25._0_8_;
        u_02[2] = auVar25._8_8_;
        u_02[3] = auVar25._16_8_;
        u_02[0] = lVar24;
        s_02[1] = uVar23;
        s_02[0] = uVar22;
        s_02[2] = (longlong)in_stack_fffffffffffff848;
        s_02[3] = (longlong)in_stack_fffffffffffff850;
        local_240 = uVar9;
        uStack_238 = uVar18;
        uStack_230 = uVar20;
        uStack_228 = uVar21;
        updot(this_00,u_02,s_02);
        local_600 = auVar3._0_8_;
        uStack_5f8 = auVar3._8_8_;
        uStack_5f0 = auVar3._16_8_;
        uStack_5e8 = auVar3._24_8_;
        a_02[2] = (float)auVar25._0_4_;
        a_02[3] = (float)auVar25._4_4_;
        a_02[4] = (float)auVar25._8_4_;
        a_02[5] = (float)auVar25._12_4_;
        a_02[6] = (float)auVar25._16_4_;
        a_02[7] = (float)auVar25._20_4_;
        a_02[0] = (float)(int)lVar24;
        a_02[1] = (float)(int)((ulong)lVar24 >> 0x20);
        b_03[2] = (float)(int)uVar23;
        b_03[3] = (float)(int)((ulong)uVar23 >> 0x20);
        b_03[0] = (float)(int)uVar22;
        b_03[1] = (float)(int)((ulong)uVar22 >> 0x20);
        b_03._16_8_ = in_stack_fffffffffffff848;
        b_03._24_8_ = in_stack_fffffffffffff850;
        c_02[2] = (float)(int)in_stack_fffffffffffff820;
        c_02[3] = (float)(int)((ulong)in_stack_fffffffffffff820 >> 0x20);
        c_02[0] = 2.759608e-39;
        c_02[1] = 0.0;
        c_02[4] = (float)(int)in_stack_fffffffffffff828;
        c_02[5] = (float)(int)((ulong)in_stack_fffffffffffff828 >> 0x20);
        c_02[6] = (float)(int)in_stack_fffffffffffff830;
        c_02[7] = (float)(int)((ulong)in_stack_fffffffffffff830 >> 0x20);
        (anonymous_namespace)::madd<float__vector(8),float__vector(8)>(a_02,b_03,c_02);
        auStack_3a0[local_568 * 4] = local_600;
        auStack_3a0[local_568 * 4 + 1] = uStack_5f8;
        auStack_3a0[local_568 * 4 + 2] = uStack_5f0;
        auStack_3a0[local_568 * 4 + 3] = uStack_5e8;
      }
    }
    for (local_5a8 = 0; local_5a8 < 4; local_5a8 = local_5a8 + 1) {
      for (local_5b0 = 0; local_5b0 < 3; local_5b0 = local_5b0 + 1) {
        x[2] = (float)(int)in_stack_fffffffffffff820;
        x[3] = (float)(int)((ulong)in_stack_fffffffffffff820 >> 0x20);
        x[0] = 2.759864e-39;
        x[1] = 0.0;
        x[4] = (float)(int)in_stack_fffffffffffff828;
        x[5] = (float)(int)((ulong)in_stack_fffffffffffff828 >> 0x20);
        x[6] = (float)(int)in_stack_fffffffffffff830;
        x[7] = (float)(int)((ulong)in_stack_fffffffffffff830 >> 0x20);
        fVar8 = hsum(x);
        *(float *)((*in_RDI)[2] +
                  (in_RDI[1][2] * (local_330 + local_5a8) + local_328 + local_5b0) * 4) = fVar8;
      }
    }
  }
  return;
}

Assistant:

NOINLINE void gemmMx4(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / RM;
        int64_t xtiles = (n - n0) / 4;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * RM;
            int64_t jj = n0 + job % xtiles * 4;
            __m256 Cv[4][RM] = {};
            for (int64_t l = 0; l < k; ++l) {
                uint64_t b_delta = ((uint64_t)B[ldb * (jj + 3) + l].d << 48) | ((uint64_t)B[ldb * (jj + 2) + l].d << 32) | ((uint64_t)B[ldb * (jj + 1) + l].d << 16) | (B[ldb * (jj + 0) + l].d);
                // Convert delta values for four blocks to float values
                __m128 db = _mm_cvtph_ps(_mm_set_epi64x(0, b_delta));
                __m256i bvec0 = load(B + ldb * (jj + 0) + l);
                __m256i bvec1 = load(B + ldb * (jj + 1) + l);
                __m256i bvec2 = load(B + ldb * (jj + 2) + l);
                __m256i bvec3 = load(B + ldb * (jj + 3) + l);
                for (int64_t i = 0; i < RM; ++i) {
                    __m128 da = _mm_set1_ps(unhalf((A[lda * (ii + i) + l].d)));
                    // Computation of product of delta values for four blocks and replicate it across 256 bit lane
                    __m256 dvec =  _mm256_castps128_ps256(_mm_mul_ps(da, db));
                    dvec = _mm256_permute2f128_ps(dvec ,dvec, 0);
                    // Computation of dot product and multiplication with appropriate delta value products
                    Cv[0][i] = madd(_mm256_shuffle_ps(dvec, dvec, 0),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec0, load(A + lda * (ii + i) + l))),
                                    Cv[0][i]);
                    Cv[1][i] = madd(_mm256_shuffle_ps(dvec, dvec, 85),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec1, load(A + lda * (ii + i) + l))),
                                    Cv[1][i]);
                    Cv[2][i] = madd(_mm256_shuffle_ps(dvec, dvec, 170),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec2, load(A + lda * (ii + i) + l))),
                                    Cv[2][i]);
                    Cv[3][i] = madd(_mm256_shuffle_ps(dvec, dvec, 255),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec3, load(A + lda * (ii + i) + l))),
                                    Cv[3][i]);
                }
            }
            for (int64_t j = 0; j < 4; ++j)
                for (int64_t i = 0; i < RM; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }